

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O1

VarId __thiscall optimization::loop_unrolling::loop_info::copy_var(loop_info *this,VarId *var)

{
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  *this_00;
  long lVar1;
  mapped_type *pmVar2;
  long in_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX;
  uint uVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_bool> pVar5;
  VarId VVar6;
  pair<const_unsigned_int,_mir::inst::Variable> local_48;
  
  this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
             *)(*(long *)&var->id + 0x38);
  lVar1 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(*(long *)&var->id + 0x40));
  uVar4 = *(int *)(lVar1 + 0x20) + 1;
  *(undefined ***)this = &PTR_display_001ee058;
  *(uint *)&this->func = uVar4;
  pmVar2 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 *)this_00,(key_type_conflict *)(in_RDX + 8));
  local_48.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
  local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar2->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (pmVar2->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.second.is_memory_var = pmVar2->is_memory_var;
  local_48.second.is_temp_var = pmVar2->is_temp_var;
  local_48.second.is_phi_var = pmVar2->is_phi_var;
  local_48.second._27_1_ = pmVar2->field_0x1b;
  local_48.second.priority = pmVar2->priority;
  local_48.first = uVar4;
  pVar5 = std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
          ::_M_insert_unique<std::pair<unsigned_int_const,mir::inst::Variable>>(this_00,&local_48);
  uVar3 = pVar5._8_8_;
  local_48.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
  if (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    uVar3 = extraout_RDX;
  }
  VVar6._8_8_ = uVar3;
  VVar6.super_Displayable._vptr_Displayable = (_func_int **)this;
  return VVar6;
}

Assistant:

mir::inst::VarId copy_var(mir::inst::VarId var) {
    auto end_iter = func.variables.end();
    end_iter--;
    mir::inst::VarId new_var(end_iter->first + 1);
    func.variables.insert({new_var, func.variables.at(var.id)});
    return new_var;
  }